

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

ExpressionValue * __thiscall
ExpressionInternal::executeFunctionCall
          (ExpressionValue *__return_storage_ptr__,ExpressionInternal *this)

{
  Identifier *name;
  ExpressionFunctionHandler *this_00;
  size_t sVar1;
  Identifier *in_RCX;
  char *text;
  optional<ExpressionFunctionHandle> oVar2;
  optional<ExpressionFunctionHandle> handle;
  size_t local_28;
  ulong local_20;
  
  name = valueAs<Identifier>(this);
  this_00 = ExpressionFunctionHandler::instance();
  oVar2 = ExpressionFunctionHandler::find(this_00,name);
  handle.super__Optional_base<ExpressionFunctionHandle,_true,_true>._M_payload.
  super__Optional_payload_base<ExpressionFunctionHandle>._M_payload =
       oVar2.super__Optional_base<ExpressionFunctionHandle,_true,_true>._M_payload.
       super__Optional_payload_base<ExpressionFunctionHandle>._M_payload;
  handle.super__Optional_base<ExpressionFunctionHandle,_true,_true>._M_payload.
  super__Optional_payload_base<ExpressionFunctionHandle>._M_engaged =
       oVar2.super__Optional_base<ExpressionFunctionHandle,_true,_true>._M_payload.
       super__Optional_payload_base<ExpressionFunctionHandle>._M_engaged;
  if (((undefined1  [16])
       oVar2.super__Optional_base<ExpressionFunctionHandle,_true,_true>._M_payload.
       super__Optional_payload_base<ExpressionFunctionHandle> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    Logger::queueError<Identifier>((Logger *)0x1,0x17ef2f,(char *)name,in_RCX);
  }
  else {
    sVar1 = ExpressionFunctionHandle::minParams((ExpressionFunctionHandle *)&handle);
    local_20 = (long)(this->children).
                     super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->children).
                     super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
    if (local_20 < sVar1) {
      local_28 = ExpressionFunctionHandle::minParams((ExpressionFunctionHandle *)&handle);
      text = "Not enough parameters for \"%s\" (%d<%d)";
    }
    else {
      sVar1 = ExpressionFunctionHandle::maxParams((ExpressionFunctionHandle *)&handle);
      local_20 = (long)(this->children).
                       super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->children).
                       super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
      if (local_20 <= sVar1) {
        ExpressionFunctionHandle::execute
                  (__return_storage_ptr__,(ExpressionFunctionHandle *)&handle,&this->children);
        return __return_storage_ptr__;
      }
      local_28 = ExpressionFunctionHandle::maxParams((ExpressionFunctionHandle *)&handle);
      text = "Too many parameters for \"%s\" (%d>%d)";
    }
    Logger::queueError<Identifier,unsigned_long,unsigned_long>(Error,text,name,&local_20,&local_28);
  }
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue ExpressionInternal::executeFunctionCall()
{
	const auto &functionName = valueAs<Identifier>();

	auto handle = ExpressionFunctionHandler::instance().find(functionName);
	if (!handle)
	{
		Logger::queueError(Logger::Error, "Unknown function \"%s\"", functionName);
		return {};
	}

	if (handle->minParams() > children.size())
	{
		Logger::queueError(Logger::Error, "Not enough parameters for \"%s\" (%d<%d)", functionName, children.size(), handle->minParams());
		return {};
	}

	if (handle->maxParams() < children.size())
	{
		Logger::queueError(Logger::Error, "Too many parameters for \"%s\" (%d>%d)", functionName, children.size(), handle->maxParams());
		return {};
	}

	return handle->execute(children);
}